

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PltFileManager.cpp
# Opt level: O0

void __thiscall
pele::physics::pltfilemanager::PltFileManager::PltFileManager
          (PltFileManager *this,string *a_pltFile)

{
  string *in_RSI;
  string *in_RDI;
  string *__new_size;
  string *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  string pltFileHeader;
  PltFileManager *in_stack_000000a0;
  string *in_stack_000008e8;
  PltFileManager *in_stack_000008f0;
  string local_30 [48];
  
  std::__cxx11::string::string(in_RDI,in_RSI);
  *(undefined4 *)(in_RDI + 0x20) = 0;
  amrex::
  Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::Vector((Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0xe3d9d8);
  *(undefined4 *)(in_RDI + 0x40) = 0;
  *(undefined8 *)(in_RDI + 0x48) = 0;
  amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::Vector
            ((Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)0xe3d9fa);
  __new_size = in_RDI + 0x68;
  amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::Vector
            ((Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)0xe3da0d);
  this_00 = in_RDI + 0x80;
  amrex::Vector<int,_std::allocator<int>_>::Vector((Vector<int,_std::allocator<int>_> *)0xe3da20);
  __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RDI + 0x98);
  amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>::Vector
            ((Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_> *)
             0xe3da36);
  amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>::Vector
            ((Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> *)0xe3da4c);
  std::operator+(__lhs,(char *)this_00);
  readGenericPlotfileHeader(in_stack_000008f0,in_stack_000008e8);
  std::vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>::resize
            ((vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_> *)
             this_00,(size_type)__new_size);
  std::vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>::resize
            ((vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> *)this_00,
             (size_type)__new_size);
  readPlotFile(in_stack_000000a0);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

PltFileManager::PltFileManager(std::string a_pltFile)
  : m_pltFile{std::move(a_pltFile)}
{
  // Get the plt metadata and resize part of the data vectors
  std::string pltFileHeader(m_pltFile + "/Header");
  readGenericPlotfileHeader(pltFileHeader);

  // Resize the actual data container
  m_dmaps.resize(m_nlevels);
  m_data.resize(m_nlevels);

  // Read the pltfile data
  readPlotFile();
}